

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O0

void __thiscall gv_visitor::visit(gv_visitor *this,EmptyExpressions *ptr)

{
  allocator<char> local_39;
  string local_38;
  EmptyExpressions *local_18;
  EmptyExpressions *ptr_local;
  gv_visitor *this_local;
  
  local_18 = ptr;
  ptr_local = (EmptyExpressions *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"empty",&local_39);
  box(this,ptr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void gv_visitor::visit(EmptyExpressions* ptr) {
    box(ptr, "empty");
    //nochildren
}